

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl_init.hpp
# Opt level: O3

void __thiscall asio::ssl::detail::openssl_init<true>::openssl_init(openssl_init<true> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  
  if (openssl_init_base::instance()::init == '\0') {
    iVar2 = __cxa_guard_acquire(&openssl_init_base::instance()::init);
    if (iVar2 != 0) {
      openssl_init_base::instance()::init = (do_init *)operator_new(1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<asio::ssl::detail::openssl_init_base::do_init*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_005dedd0,
                 openssl_init_base::instance()::init);
      __cxa_atexit(std::
                   __shared_ptr<asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                   ::~__shared_ptr,&openssl_init_base::instance()::init,&__dso_handle);
      __cxa_guard_release(&openssl_init_base::instance()::init);
    }
  }
  (this->ref_).
  super___shared_ptr<asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = openssl_init_base::instance()::init;
  p_Var1 = DAT_005dedd0;
  (this->ref_).
  super___shared_ptr<asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = DAT_005dedd0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

openssl_init()
    : ref_(instance())
  {
    using namespace std; // For memmove.

    // Ensure openssl_init::instance_ is linked in.
    openssl_init* tmp = &instance_;
    memmove(&tmp, &tmp, sizeof(openssl_init*));
  }